

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O2

path * __thiscall filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  long lVar1;
  string s;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)&s,"",(allocator *)local_40);
    path(__return_storage_ptr__,&s);
  }
  else {
    std::__cxx11::string::string((string *)&s,(string *)this);
    std::__cxx11::string::substr((ulong)local_40,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,local_40);
    std::__cxx11::string::~string(local_40);
    path(__return_storage_ptr__,&s);
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

path parent_path() const
    {
        std::size_t found = this->path_.find_last_of(separator_);
        if (found != std::string::npos) {
            // Separator found
            std::string s(this->path_);
            s = s.substr(0, found);
            return path(s);
        }
        else {
            return path("");
        }
    }